

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

Status __thiscall
sentencepiece::SentencePieceProcessor::Encode
          (SentencePieceProcessor *this,string_view input,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pieces)

{
  bool bVar1;
  undefined1 uVar2;
  StatusBuilder *this_00;
  reference __args;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  in_RDI;
  long in_R8;
  SentencePieceText_SentencePiece *sp;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *__range1;
  SentencePieceText spt;
  Status *_status;
  RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *in_stack_fffffffffffffd08;
  StatusBuilder *in_stack_fffffffffffffd10;
  RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  iterator local_250;
  RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece> local_248;
  RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *local_240;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  byte local_221;
  SentencePieceText local_220;
  undefined4 local_1c4;
  uint local_40;
  byte local_29;
  long local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_29 = 0;
  local_28 = in_R8;
  local_18 = in_RDX;
  uStack_10 = in_RCX;
  (**(code **)(*in_RSI + 0x38))
            (in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
  bVar1 = util::Status::ok((Status *)0x3de8a0);
  if (!bVar1) {
    local_29 = 1;
  }
  local_40 = (uint)!bVar1;
  if ((local_29 & 1) == 0) {
    util::Status::~Status((Status *)0x3de913);
  }
  if (local_40 == 0) {
    if (local_28 == 0) {
      util::StatusBuilder::StatusBuilder
                (in_stack_fffffffffffffd10,(StatusCode)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd10,(char (*) [57])in_stack_fffffffffffffd08);
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd10,(char (*) [2])in_stack_fffffffffffffd08);
      local_1c4 = 0x17d;
      util::StatusBuilder::operator<<(in_stack_fffffffffffffd10,(int *)in_stack_fffffffffffffd08);
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd10,(char (*) [4])in_stack_fffffffffffffd08);
      this_00 = util::StatusBuilder::operator<<
                          (in_stack_fffffffffffffd10,(char (*) [7])in_stack_fffffffffffffd08);
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd10,(char (*) [3])in_stack_fffffffffffffd08);
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffd10,(char (*) [25])in_stack_fffffffffffffd08);
      util::StatusBuilder::operator_cast_to_Status(this_00);
      util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x3dea23);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x3dea5b);
      SentencePieceText::SentencePieceText((SentencePieceText *)0x3dea68);
      local_221 = 0;
      local_238 = (undefined4)local_18;
      uStack_234 = local_18._4_4_;
      uStack_230 = (undefined4)uStack_10;
      uStack_22c = uStack_10._4_4_;
      (**(code **)(*in_RSI + 200))
                (in_RDI._M_t.
                 super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                 .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl,
                 in_RSI,local_18,uStack_10,&local_220);
      bVar1 = util::Status::ok((Status *)0x3deac3);
      if (!bVar1) {
        local_221 = 1;
      }
      local_40 = (uint)!bVar1;
      if ((local_221 & 1) == 0) {
        util::Status::~Status((Status *)0x3deb49);
      }
      if (local_40 == 0) {
        local_240 = SentencePieceText::pieces(&local_220);
        local_248.it_ =
             (void **)google::protobuf::
                      RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::begin
                                (in_stack_fffffffffffffd08);
        local_250.it_ =
             (void **)google::protobuf::
                      RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::end
                                (in_stack_fffffffffffffd18);
        while (uVar2 = google::protobuf::internal::
                       RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece>::
                       operator!=(&local_248,&local_250), (bool)uVar2) {
          __args = google::protobuf::internal::
                   RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece>::
                   operator*(&local_248);
          in_stack_fffffffffffffd10 =
               (StatusBuilder *)
               SentencePieceText_SentencePiece::piece_abi_cxx11_
                         ((SentencePieceText_SentencePiece *)0x3dec20);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(uVar2,in_stack_fffffffffffffd20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
          google::protobuf::internal::
          RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece>::operator++
                    (&local_248);
        }
        util::OkStatus();
        local_40 = 1;
      }
      SentencePieceText::~SentencePieceText((SentencePieceText *)in_stack_fffffffffffffd10);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceProcessor::Encode(
    absl::string_view input, std::vector<std::string> *pieces) const {
  CHECK_OR_RETURN_STATUS_STL(pieces);

  SentencePieceText spt;
  RETURN_IF_ERROR(Encode(input, &spt));
  for (const auto &sp : spt.pieces()) {
    pieces->emplace_back(sp.piece());
  }

  return util::OkStatus();
}